

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O1

int cram_write_SAM_hdr(cram_fd *fd,SAM_hdr *hdr)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  cram_file_def *def;
  hFILE *fp;
  ref_entry **pprVar4;
  ref_entry *prVar5;
  int64_t iVar6;
  int iVar7;
  int iVar8;
  SAM_RG *pSVar9;
  char *pcVar10;
  ulong uVar11;
  SAM_hdr_type *type;
  SAM_hdr_tag *pSVar12;
  long lVar13;
  char *pcVar14;
  cram_block *b;
  cram_container *c;
  uchar *puVar15;
  int32_t *piVar16;
  void *__src;
  int iVar17;
  SAM_hdr *extraout_RDX;
  SAM_hdr *extraout_RDX_00;
  SAM_hdr *extraout_RDX_01;
  SAM_hdr *h;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  size_t sVar21;
  int iVar22;
  int32_t iVar23;
  size_t sVar24;
  size_t sVar25;
  ulong uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  uchar buf [16];
  uchar buf2 [33];
  MD5_CTX md5;
  int local_1080;
  byte local_1078 [16];
  char local_1068 [48];
  MD5_CTX local_1038 [44];
  undefined1 local_39;
  
  iVar8 = fd->version;
  def = fd->file_def;
  if (def->major_version == '\0') {
    def->major_version = (uint8_t)((uint)iVar8 >> 8);
    def->minor_version = (uint8_t)iVar8;
    iVar7 = cram_write_file_def(fd,def);
    if (iVar7 != 0) {
      return -1;
    }
  }
  if ((((fd->version & 0xffffff00U) == 0x100) &&
      (pSVar9 = sam_hdr_find_rg(hdr,"UNKNOWN"), pSVar9 == (SAM_RG *)0x0)) &&
     (iVar7 = sam_hdr_add(hdr,"RG","ID","UNKNOWN","SM","UNKNOWN",0), iVar7 != 0)) {
    return -1;
  }
  if (((fd->refs != (refs_t *)0x0) && (fd->no_ref == 0)) && (0 < hdr->nref)) {
    lVar27 = 0;
    do {
      type = sam_hdr_find(hdr,"SQ","SN",hdr->ref[lVar27].name);
      if (type == (SAM_hdr_type *)0x0) {
        return -1;
      }
      pSVar12 = sam_hdr_find_key(hdr,type,"M5",(SAM_hdr_tag **)0x0);
      if (pSVar12 == (SAM_hdr_tag *)0x0) {
        if (fd->refs == (refs_t *)0x0) {
          return -1;
        }
        pprVar4 = fd->refs->ref_id;
        if (pprVar4 == (ref_entry **)0x0) {
          return -1;
        }
        prVar5 = pprVar4[lVar27];
        if (prVar5 == (ref_entry *)0x0) {
          return -1;
        }
        iVar6 = prVar5->length;
        MD5_Init(local_1038);
        pcVar10 = cram_get_ref(fd,(int)lVar27,1,(int)iVar6);
        if (pcVar10 == (char *)0x0) {
          return -1;
        }
        MD5_Update(local_1038,pcVar10,(long)(int)fd->refs->ref_id[lVar27]->length);
        MD5_Final(local_1078,local_1038);
        cram_ref_decr(fd->refs,(int)lVar27);
        lVar13 = 0;
        do {
          bVar1 = local_1078[lVar13];
          local_1068[lVar13 * 2] = "0123456789abcdef"[bVar1 >> 4];
          local_1068[lVar13 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 0x10);
        local_1068[0x20] = 0;
        iVar7 = sam_hdr_update(hdr,type,"M5",local_1068,0);
        if (iVar7 != 0) {
          return -1;
        }
      }
      pcVar10 = fd->ref_fn;
      if (pcVar10 != (char *)0x0) {
        if (*pcVar10 == '/') {
          strncpy((char *)local_1038,pcVar10,0x1000);
          local_39 = 0;
        }
        else {
          pcVar14 = getcwd((char *)local_1038,0x1000);
          if (pcVar14 != (char *)0x0) {
            sVar24 = strlen((char *)local_1038);
            sVar21 = strlen(pcVar10);
            if (sVar21 + ((long)((sVar24 << 0x20) + 0x100000000) >> 0x20) < 0x1000) {
              local_1080 = (int)sVar24;
              sprintf((char *)((long)local_1038[0].data + ((long)(sVar24 << 0x20) >> 0x20) + -0x18),
                      "/%.*s",(ulong)(0x1000 - local_1080),pcVar10);
              goto LAB_0013260c;
            }
          }
          strncpy((char *)local_1038,pcVar10,0x1000);
          local_39 = 0;
        }
LAB_0013260c:
        iVar7 = sam_hdr_update(hdr,type,"UR",local_1038,0);
        if (iVar7 != 0) {
          return -1;
        }
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 < hdr->nref);
  }
  iVar7 = sam_hdr_rebuild(hdr);
  if (iVar7 != 0) {
    return -1;
  }
  iVar7 = sam_hdr_length(hdr);
  if ((fd->version & 0xffffff00U) == 0x100) {
    iVar8 = int32_encode(fd,iVar7);
    if (iVar8 == -1) {
      return -1;
    }
    uVar26 = (ulong)iVar7;
    fp = fd->fp;
    pcVar10 = sam_hdr_str(hdr);
    uVar18 = (long)fp->limit - (long)fp->begin;
    uVar11 = uVar26;
    if (uVar18 < uVar26) {
      uVar11 = uVar18;
    }
    memcpy(fp->begin,pcVar10,uVar11);
    fp->begin = fp->begin + uVar11;
    h = extraout_RDX;
    if (uVar18 < uVar26) {
      uVar11 = hwrite2(fp,pcVar10,uVar26,uVar11);
      h = extraout_RDX_00;
    }
    if (uVar11 != uVar26) {
      return -1;
    }
LAB_00132cb9:
    iVar8 = refs_from_header(fd->refs,(cram_fd *)fd->header,h);
    if (iVar8 != -1) {
      iVar8 = refs2id(fd->refs,fd->header);
      if (iVar8 != -1) {
        iVar8 = hflush(fd->fp);
        return -(uint)(iVar8 != 0);
      }
      return -1;
    }
  }
  else {
    b = (cram_block *)malloc(0x40);
    if (b == (cram_block *)0x0) {
      b = (cram_block *)0x0;
    }
    else {
      b->data = (uchar *)0x0;
      b->alloc = 0;
      b->byte = 0;
      b->method = RAW;
      b->orig_method = RAW;
      b->content_type = FILE_HEADER;
      b->content_id = 0;
      b->comp_size = 0;
      b->uncomp_size = 0;
      b->bit = 7;
    }
    c = cram_new_container(0,0);
    if (b == (cram_block *)0x0 || c == (cram_container *)0x0) {
      if (b != (cram_block *)0x0) {
        cram_free_block(b);
      }
      if (c == (cram_container *)0x0) {
        return -1;
      }
    }
    else {
      iVar20 = fd->version;
      int32_put(b,iVar7);
      sVar24 = (size_t)iVar7;
      uVar11 = b->alloc;
      sVar25 = b->byte;
      if (uVar11 <= sVar25 + sVar24) {
        do {
          auVar28._8_4_ = (int)(uVar11 >> 0x20);
          auVar28._0_8_ = uVar11;
          auVar28._12_4_ = 0x45300000;
          dVar31 = ((auVar28._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 1.5;
          uVar18 = (ulong)dVar31;
          sVar21 = (long)(dVar31 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18;
          if (uVar11 == 0) {
            sVar21 = 0x400;
          }
          b->alloc = sVar21;
          puVar15 = (uchar *)realloc(b->data,sVar21);
          b->data = puVar15;
          uVar11 = b->alloc;
          sVar25 = b->byte;
        } while (uVar11 <= sVar25 + sVar24);
      }
      puVar15 = b->data;
      pcVar10 = sam_hdr_str(hdr);
      memcpy(puVar15 + sVar25,pcVar10,sVar24);
      sVar25 = sVar24 + b->byte;
      b->byte = sVar25;
      iVar23 = (int32_t)sVar25;
      b->uncomp_size = iVar23;
      b->comp_size = iVar23;
      if ((0x2ff < fd->version) && (0 < fd->level)) {
        cram_compress_block(fd,b,(cram_metrics *)0x0,
                            (uint)(fd->use_bz2 != 0) * 4 + (uint)(fd->use_lzma != 0) * 8 + 2,
                            fd->level);
      }
      if (iVar8 >> 8 < 3) {
        c->num_blocks = 1;
        c->num_landmarks = 1;
        piVar16 = (int32_t *)malloc(4);
        c->landmark = piVar16;
        if (piVar16 == (int32_t *)0x0) {
          return -1;
        }
        *piVar16 = 0;
        dVar31 = (double)c->length * 1.5;
        if (dVar31 <= 10000.0) {
          dVar31 = 10000.0;
        }
        uVar2 = b->content_id;
        iVar7 = 1;
        iVar17 = 1;
        if (((0x7f < uVar2) && (iVar17 = 2, 0x3fff < uVar2)) && (iVar17 = 3, 0x1fffff < uVar2)) {
          iVar17 = 5 - (uint)(uVar2 < 0x10000000);
        }
        uVar2 = b->comp_size;
        uVar19 = b->uncomp_size;
        if (((0x7f < uVar19) && (iVar7 = 2, 0x3fff < uVar19)) && (iVar7 = 3, 0x1fffff < uVar19)) {
          iVar7 = 5 - (uint)(uVar19 < 0x10000000);
        }
        uVar19 = (uint)(dVar31 - (double)c->length);
        iVar22 = 1;
        if (((0x7f < uVar2) && (iVar22 = 2, 0x3fff < uVar2)) && (iVar22 = 3, 0x1fffff < uVar2)) {
          iVar22 = 5 - (uint)(uVar2 < 0x10000000);
        }
        c->length = iVar22 + uVar2 + (uint)(0x2ff < iVar20) * 4 + iVar17 + iVar7 + uVar19 + 2;
        sVar24 = (size_t)(int)uVar19;
        __src = calloc(1,sVar24);
        if (__src != (void *)0x0) {
          uVar11 = b->alloc;
          sVar25 = b->byte;
          if (uVar11 <= sVar25 + sVar24) {
            do {
              auVar29._8_4_ = (int)(uVar11 >> 0x20);
              auVar29._0_8_ = uVar11;
              auVar29._12_4_ = 0x45300000;
              dVar31 = ((auVar29._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 1.5;
              uVar18 = (ulong)dVar31;
              sVar21 = (long)(dVar31 - 9.223372036854776e+18) & (long)uVar18 >> 0x3f | uVar18;
              if (uVar11 == 0) {
                sVar21 = 0x400;
              }
              b->alloc = sVar21;
              puVar15 = (uchar *)realloc(b->data,sVar21);
              b->data = puVar15;
              uVar11 = b->alloc;
              sVar25 = b->byte;
            } while (uVar11 <= sVar25 + sVar24);
          }
          memcpy(b->data + sVar25,__src,sVar24);
          sVar25 = sVar24 + b->byte;
          b->byte = sVar25;
          iVar23 = (int32_t)sVar25;
          b->uncomp_size = iVar23;
          b->comp_size = iVar23;
          free(__src);
          goto LAB_00132bbd;
        }
      }
      else {
        uVar2 = b->content_id;
        iVar17 = 1;
        iVar7 = 1;
        if (((0x7f < uVar2) && (iVar7 = 2, 0x3fff < uVar2)) && (iVar7 = 3, 0x1fffff < uVar2)) {
          iVar7 = 5 - (uint)(uVar2 < 0x10000000);
        }
        uVar19 = b->comp_size;
        uVar3 = b->uncomp_size;
        if (((0x7f < uVar3) && (iVar17 = 2, 0x3fff < uVar3)) && (iVar17 = 3, 0x1fffff < uVar3)) {
          iVar17 = 5 - (uint)(uVar3 < 0x10000000);
        }
        iVar22 = (uint)(0x2ff < iVar20) * 4;
        iVar20 = 1;
        if (((0x7f < uVar19) && (iVar20 = 2, 0x3fff < uVar19)) && (iVar20 = 3, 0x1fffff < uVar19)) {
          iVar20 = 5 - (uint)(uVar19 < 0x10000000);
        }
        iVar7 = iVar20 + iVar7 + iVar17 + uVar19 + iVar22 + 2;
        c->length = iVar7;
        c->num_blocks = 2;
        c->num_landmarks = 2;
        piVar16 = (int32_t *)malloc(8);
        c->landmark = piVar16;
        if (piVar16 != (int32_t *)0x0) {
          *piVar16 = 0;
          piVar16[1] = iVar7;
          dVar31 = (double)iVar7 * 0.5;
          if (10000.0 <= dVar31) {
            dVar31 = 10000.0;
          }
          uVar19 = (uint)dVar31;
          iVar20 = 1;
          if (((0x7f < uVar2) && (iVar20 = 2, 0x3fff < uVar2)) && (iVar20 = 3, 0x1fffff < uVar2)) {
            iVar20 = 5 - (uint)(uVar2 < 0x10000000);
          }
          iVar17 = 2;
          if (((0x7f < uVar19) && (iVar17 = 4, 0x3fff < uVar19)) && (iVar17 = 6, 0x1fffff < uVar19))
          {
            iVar17 = (uint)(0xfffffff < uVar19) * 2 + 8;
          }
          c->length = iVar17 + iVar7 + iVar22 + iVar20 + uVar19 + 2;
LAB_00132bbd:
          iVar7 = cram_write_container(fd,c);
          if ((iVar7 != -1) && (iVar7 = cram_write_block(fd,b), iVar7 != -1)) {
            if (2 < iVar8 >> 8) {
              uVar18 = (ulong)(int)uVar19;
              uVar11 = b->alloc;
              while (uVar11 <= uVar18) {
                auVar30._8_4_ = (int)(uVar11 >> 0x20);
                auVar30._0_8_ = uVar11;
                auVar30._12_4_ = 0x45300000;
                dVar31 = ((auVar30._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar11) - 4503599627370496.0)) * 1.5;
                uVar26 = (ulong)dVar31;
                sVar24 = (long)(dVar31 - 9.223372036854776e+18) & (long)uVar26 >> 0x3f | uVar26;
                if (uVar11 == 0) {
                  sVar24 = 0x400;
                }
                b->alloc = sVar24;
                puVar15 = (uchar *)realloc(b->data,sVar24);
                b->data = puVar15;
                uVar11 = b->alloc;
              }
              memset(b->data,0,uVar18);
              b->byte = uVar18;
              b->uncomp_size = uVar19;
              b->comp_size = uVar19;
              b->method = RAW;
              iVar8 = cram_write_block(fd,b);
              if (iVar8 == -1) goto LAB_00132cf3;
            }
            cram_free_block(b);
            cram_free_container(c);
            h = extraout_RDX_01;
            goto LAB_00132cb9;
          }
        }
      }
LAB_00132cf3:
      cram_free_block(b);
    }
    cram_free_container(c);
  }
  return -1;
}

Assistant:

int cram_write_SAM_hdr(cram_fd *fd, SAM_hdr *hdr) {
    int header_len;
    int blank_block = (CRAM_MAJOR_VERS(fd->version) >= 3);

    /* Write CRAM MAGIC if not yet written. */
    if (fd->file_def->major_version == 0) {
	fd->file_def->major_version = CRAM_MAJOR_VERS(fd->version);
	fd->file_def->minor_version = CRAM_MINOR_VERS(fd->version);
	if (0 != cram_write_file_def(fd, fd->file_def))
	    return -1;
    }

    /* 1.0 requires and UNKNOWN read-group */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if (!sam_hdr_find_rg(hdr, "UNKNOWN"))
	    if (sam_hdr_add(hdr, "RG",
			    "ID", "UNKNOWN", "SM", "UNKNOWN", NULL))
		return -1;
    }

    /* Fix M5 strings */
    if (fd->refs && !fd->no_ref) {
	int i;
	for (i = 0; i < hdr->nref; i++) {
	    SAM_hdr_type *ty;
	    char *ref;

	    if (!(ty = sam_hdr_find(hdr, "SQ", "SN", hdr->ref[i].name)))
		return -1;

	    if (!sam_hdr_find_key(hdr, ty, "M5", NULL)) {
		char unsigned buf[16], buf2[33];
		int j, rlen;
		MD5_CTX md5;

		if (!fd->refs ||
		    !fd->refs->ref_id ||
		    !fd->refs->ref_id[i]) {
		    return -1;
		}
		rlen = fd->refs->ref_id[i]->length;
		MD5_Init(&md5);
		ref = cram_get_ref(fd, i, 1, rlen);
		if (NULL == ref) return -1;
		rlen = fd->refs->ref_id[i]->length; /* In case it just loaded */
		MD5_Update(&md5, ref, rlen);
		MD5_Final(buf, &md5);
		cram_ref_decr(fd->refs, i);

		for (j = 0; j < 16; j++) {
		    buf2[j*2+0] = "0123456789abcdef"[buf[j]>>4];
		    buf2[j*2+1] = "0123456789abcdef"[buf[j]&15];
		}
		buf2[32] = 0;
		if (sam_hdr_update(hdr, ty, "M5", buf2, NULL))
		    return -1;
	    }

	    if (fd->ref_fn) {
		char ref_fn[PATH_MAX];
		full_path(ref_fn, fd->ref_fn);
		if (sam_hdr_update(hdr, ty, "UR", ref_fn, NULL))
		    return -1;
	    }
	}
    }

    if (sam_hdr_rebuild(hdr))
	return -1;

    /* Length */
    header_len = sam_hdr_length(hdr);
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	if (-1 == int32_encode(fd, header_len))
	    return -1;

	/* Text data */
	if (header_len != hwrite(fd->fp, sam_hdr_str(hdr), header_len))
	    return -1;
    } else {
	/* Create block(s) inside a container */
	cram_block *b = cram_new_block(FILE_HEADER, 0);
	cram_container *c = cram_new_container(0, 0);
	int padded_length;
	char *pads;
	int is_cram_3 = (CRAM_MAJOR_VERS(fd->version) >= 3);

	if (!b || !c) {
	    if (b) cram_free_block(b);
	    if (c) cram_free_container(c);
	    return -1;
	}

	int32_put(b, header_len);
	BLOCK_APPEND(b, sam_hdr_str(hdr), header_len);
	BLOCK_UPLEN(b);

	// Compress header block if V3.0 and above
	if (CRAM_MAJOR_VERS(fd->version) >= 3 && fd->level > 0) {
	    int method = 1<<GZIP;
	    if (fd->use_bz2)
		method |= 1<<BZIP2;
	    if (fd->use_lzma)
		method |= 1<<LZMA;
	    cram_compress_block(fd, b, NULL, method, fd->level);
	} 

	if (blank_block) {
	    c->length = b->comp_size + 2 + 4*is_cram_3 +
		itf8_size(b->content_id)   + 
		itf8_size(b->uncomp_size)  +
		itf8_size(b->comp_size);

	    c->num_blocks = 2;
	    c->num_landmarks = 2;
	    if (!(c->landmark = malloc(2*sizeof(*c->landmark)))) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	    c->landmark[0] = 0;
	    c->landmark[1] = c->length;

	    // Plus extra storage for uncompressed secondary blank block
	    padded_length = MIN(c->length*.5, 10000);
	    c->length += padded_length + 2 + 4*is_cram_3 +
		itf8_size(b->content_id) + 
		itf8_size(padded_length)*2;
	} else {
	    // Pad the block instead.
	    c->num_blocks = 1;
	    c->num_landmarks = 1;
	    if (!(c->landmark = malloc(sizeof(*c->landmark))))
		return -1;
	    c->landmark[0] = 0;

	    padded_length = MAX(c->length*1.5, 10000) - c->length;

	    c->length = b->comp_size + padded_length +
		2 + 4*is_cram_3 +
		itf8_size(b->content_id)   + 
		itf8_size(b->uncomp_size)  +
		itf8_size(b->comp_size);

	    if (NULL == (pads = calloc(1, padded_length))) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	    BLOCK_APPEND(b, pads, padded_length);
	    BLOCK_UPLEN(b);
	    free(pads);
	}

	if (-1 == cram_write_container(fd, c)) {
	    cram_free_block(b);
	    cram_free_container(c);
	    return -1;
	}

	if (-1 == cram_write_block(fd, b)) {
	    cram_free_block(b);
	    cram_free_container(c);
	    return -1;
	}

	if (blank_block) {
	    BLOCK_RESIZE(b, padded_length);
	    memset(BLOCK_DATA(b), 0, padded_length);
	    BLOCK_SIZE(b) = padded_length;
	    BLOCK_UPLEN(b);
	    b->method = RAW;
	    if (-1 == cram_write_block(fd, b)) {
		cram_free_block(b);
		cram_free_container(c);
		return -1;
	    }
	}

	cram_free_block(b);
	cram_free_container(c);
    }

    if (-1 == refs_from_header(fd->refs, fd, fd->header))
	return -1;
    if (-1 == refs2id(fd->refs, fd->header))
	return -1;

    if (0 != hflush(fd->fp))
	return -1;

    RP("=== Finishing saving header ===\n");

    return 0;
}